

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

Value * __thiscall ccd::Json::Value::operator[](Value *this,string *key)

{
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
  *this_01;
  mapped_type *pmVar1;
  allocator<char> local_19;
  string *local_18;
  string *key_local;
  Value *this_local;
  
  if (this->m_type == Null) {
    this->m_type = Object;
  }
  local_18 = key;
  key_local = (string *)this;
  if (this->m_type != Object) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,"Item is no Object",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_01 = std::
            get<std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                      (&this->m_value);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
           ::operator[](this_01,local_18);
  return pmVar1;
}

Assistant:

Value& Value::operator[] ( const std::string& key )
{
	if ( m_type == Type::Null ) {
		m_type = Type::Object;
	}

	if ( m_type != Type::Object )
		throw std::string ( "Item is no Object" );


	return std::get<Object>(m_value)[key];
}